

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkYddNorm(ARKodeMem ark_mem,sunrealtype hg,sunrealtype *yddnrm)

{
  int iVar1;
  undefined8 *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  undefined8 uVar2;
  int retval;
  undefined4 local_4;
  
  N_VLinearSum(in_XMM0_Qa,0x3ff0000000000000,*(undefined8 *)(in_RDI + 600),
               *(undefined8 *)(in_RDI + 0x250),*(undefined8 *)(in_RDI + 0x248));
  iVar1 = (**(code **)(in_RDI + 0x98))
                    (*(double *)(in_RDI + 0x2f0) + in_XMM0_Qa,in_RDI,*(undefined8 *)(in_RDI + 0x248)
                     ,*(undefined8 *)(in_RDI + 0x268),2);
  if (iVar1 == 0) {
    N_VLinearSum(1.0 / in_XMM0_Qa,-1.0 / in_XMM0_Qa,*(undefined8 *)(in_RDI + 0x268),
                 *(undefined8 *)(in_RDI + 600),*(undefined8 *)(in_RDI + 0x268));
    N_VScale(0x3ff0000000000000,*(undefined8 *)(in_RDI + 0x250),*(undefined8 *)(in_RDI + 0x248));
    uVar2 = N_VWrmsNorm(*(undefined8 *)(in_RDI + 0x268),*(undefined8 *)(in_RDI + 0x230));
    *in_RSI = uVar2;
    local_4 = 0;
  }
  else {
    local_4 = -8;
  }
  return local_4;
}

Assistant:

int arkYddNorm(ARKodeMem ark_mem, sunrealtype hg, sunrealtype* yddnrm)
{
  int retval;

  /* increment y with a multiple of f */
  N_VLinearSum(hg, ark_mem->fn, ONE, ark_mem->yn, ark_mem->ycur);

  /* compute y', via the ODE RHS routine */
  retval = ark_mem->step_fullrhs(ark_mem, ark_mem->tcur + hg, ark_mem->ycur,
                                 ark_mem->tempv1, ARK_FULLRHS_OTHER);
  if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

  /* difference new f and original f to estimate y'' */
  N_VLinearSum(ONE / hg, ark_mem->tempv1, -ONE / hg, ark_mem->fn,
               ark_mem->tempv1);

  /* reset ycur to equal yn (unnecessary?) */
  N_VScale(ONE, ark_mem->yn, ark_mem->ycur);

  /* compute norm of y'' */
  *yddnrm = N_VWrmsNorm(ark_mem->tempv1, ark_mem->ewt);

  return (ARK_SUCCESS);
}